

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::~lexer(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
         *this)

{
  long in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x48));
  std::vector<char,_std::allocator<char>_>::~vector(unaff_retaddr);
  std::shared_ptr<nlohmann::detail::input_adapter_protocol>::~shared_ptr
            ((shared_ptr<nlohmann::detail::input_adapter_protocol> *)0x12d8f4);
  return;
}

Assistant:

~lexer() = default;